

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_read.cpp
# Opt level: O0

bool __thiscall
ritobin::io::impl_text_read::BinTextReader::read_value_visit(BinTextReader *this,Embed *value)

{
  char *pcVar1;
  bool bVar2;
  char *start_3;
  char *start_2;
  char *start_1;
  char *pcStack_28;
  bool end;
  char *start;
  Embed *value_local;
  BinTextReader *this_local;
  
  pcStack_28 = (this->reader).cur_;
  start = (char *)value;
  value_local = (Embed *)this;
  bVar2 = TextReader::read_hash_name(&this->reader,&value->name);
  if (bVar2) {
    start_1._7_1_ = 0;
    pcVar1 = (this->reader).cur_;
    bVar2 = TextReader::read_nested_begin(&this->reader,(bool *)((long)&start_1 + 7));
    if (bVar2) {
      do {
        if (((start_1._7_1_ ^ 0xff) & 1) == 0) {
          return true;
        }
        pcVar1 = (this->reader).cur_;
        bVar2 = read_field(this,(FieldList *)(start + 0x28));
        if (!bVar2) {
          bVar2 = fail_msg(this,"read_field(value.items)",pcVar1);
          return bVar2;
        }
        pcVar1 = (this->reader).cur_;
        bVar2 = TextReader::read_nested_separator_or_end(&this->reader,(bool *)((long)&start_1 + 7))
        ;
      } while (bVar2);
      this_local._7_1_ = fail_msg(this,"reader.read_nested_separator_or_end(end)",pcVar1);
    }
    else {
      this_local._7_1_ = fail_msg(this,"reader.read_nested_begin(end)",pcVar1);
    }
  }
  else {
    this_local._7_1_ = fail_msg(this,"reader.read_hash_name(value.name)",pcStack_28);
  }
  return this_local._7_1_;
}

Assistant:

bool read_value_visit(Embed& value) noexcept {
            bin_assert(reader.read_hash_name(value.name));
            bool end = false;
            bin_assert(reader.read_nested_begin(end));
            while (!end) {
                bin_assert(read_field(value.items));
                bin_assert(reader.read_nested_separator_or_end(end));
            }
            return true;
        }